

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O0

void __thiscall VideoNode::paint(VideoNode *this,float dt,Timecode *tc,IScope *scope)

{
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  VideoEngine *this_00;
  type resources;
  shared_ptr<renderdesc::Pipeline> *pipeline;
  pointer pVVar4;
  int in_ECX;
  nfds_t __nfds;
  IScope *scope_local;
  Timecode *tc_local;
  float dt_local;
  VideoNode *this_local;
  
  paint::frame_seq = paint::frame_seq + 1;
  pPVar3 = std::unique_ptr<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>::operator->
                     (&this->polled_pipeline);
  uVar2 = PolledPipelineDesc::poll(pPVar3,(pollfd *)(ulong)paint::frame_seq,__nfds,in_ECX);
  if ((uVar2 & 1) != 0) {
    this_00 = (VideoEngine *)operator_new(0x80);
    resources = std::unique_ptr<Resources,_std::default_delete<Resources>_>::operator*
                          (&this->resources);
    pPVar3 = std::unique_ptr<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>::
             operator->(&this->polled_pipeline);
    pipeline = PolledPipelineDesc::get(pPVar3);
    VideoEngine::VideoEngine(this_00,resources,pipeline);
    std::unique_ptr<VideoEngine,_std::default_delete<VideoEngine>_>::reset(&this->engine,this_00);
    pVVar4 = std::unique_ptr<VideoEngine,_std::default_delete<VideoEngine>_>::operator->
                       (&this->engine);
    VideoEngine::setCanvasResolution
              (pVVar4,c_mode_res[this->mode_index].w,c_mode_res[this->mode_index].h);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->engine);
  if (bVar1) {
    pVVar4 = std::unique_ptr<VideoEngine,_std::default_delete<VideoEngine>_>::operator->
                       (&this->engine);
    VideoEngine::paint(pVVar4,paint::frame_seq,(this->preview).w,(this->preview).h,tc->row,dt,scope)
    ;
  }
  return;
}

Assistant:

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}